

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O3

void __thiscall ktx::CommandHelp::executeHelp(CommandHelp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  path *__p;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string systemCommand;
  string systemCommand_1;
  string manFile;
  path executableDir;
  path executablePath;
  string local_118;
  undefined1 local_f8 [40];
  size_type sStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  path local_80;
  path local_58;
  
  std::filesystem::__cxx11::path::path<char[15],std::filesystem::__cxx11::path>
            ((path *)local_f8,(char (*) [15])"/proc/self/exe",auto_format);
  std::filesystem::canonical(&local_58);
  std::filesystem::__cxx11::path::~path((path *)local_f8);
  std::filesystem::__cxx11::path::path((path *)local_f8,&local_58);
  __p = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path(&local_80,__p);
  std::filesystem::__cxx11::path::~path((path *)local_f8);
  paVar1 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,local_80._M_pathname._M_dataplus._M_p,
             local_80._M_pathname._M_dataplus._M_p + local_80._M_pathname._M_string_length);
  bVar2 = *(bool *)((long)&(this->options).super_OptionsHelp.command.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   + 0x20);
  pcVar6 = "";
  std::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
            (&local_c0,(optional<std::__cxx11::string> *)&this->options,(char (*) [1])0x217ddc);
  if (bVar2 != false) {
    pcVar6 = "_";
  }
  local_f8._0_8_ = local_118._M_dataplus._M_p;
  local_f8._8_8_ = local_118._M_string_length;
  local_f8._32_8_ = local_c0._M_dataplus._M_p;
  sStack_d0 = local_c0._M_string_length;
  fmt.size_ = 0xdcd;
  fmt.data_ = (char *)0x1e;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_f8;
  local_f8._16_8_ = pcVar6;
  ::fmt::v10::vformat_abi_cxx11_(&local_a0,(v10 *)"{}/../share/man/man1/ktx{}{}.1",fmt,args);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar1) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_f8,&local_a0,auto_format);
  cVar3 = std::filesystem::status((path *)local_f8);
  std::filesystem::__cxx11::path::~path((path *)local_f8);
  if ((cVar3 == '\0') || (cVar3 == -1)) {
    bVar2 = *(bool *)((long)&(this->options).super_OptionsHelp.command.
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     + 0x20);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x217ddc;
    std::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
              (&local_c0,(optional<std::__cxx11::string> *)&this->options,(char (*) [1])0x217ddc);
    if (bVar2 != false) {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x207b15;
    }
    local_f8._16_8_ = local_c0._M_dataplus._M_p;
    local_f8._24_8_ = local_c0._M_string_length;
    fmt_00.size_ = 0xdc;
    fmt_00.data_ = (char *)0xb;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_f8;
    local_f8._0_8_ = paVar4;
    ::fmt::v10::vformat_abi_cxx11_(&local_118,(v10 *)"man ktx{}{}",fmt_00,args_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    system(local_118._M_dataplus._M_p);
    _Var5._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == paVar1) goto LAB_0019fa04;
  }
  else {
    local_118._M_dataplus._M_p = local_a0._M_dataplus._M_p;
    local_118._M_string_length = local_a0._M_string_length;
    fmt_01.size_ = 0xd;
    fmt_01.data_ = (char *)0x8;
    args_01.field_1.values_ = in_R9.values_;
    args_01.desc_ = (unsigned_long_long)&local_118;
    ::fmt::v10::vformat_abi_cxx11_((string *)local_f8,(v10 *)"man \"{}\"",fmt_01,args_01);
    system((char *)local_f8._0_8_);
    local_118.field_2._M_allocated_capacity = local_f8._16_8_;
    _Var5._M_p = (pointer)local_f8._0_8_;
    if ((undefined1 *)local_f8._0_8_ == local_f8 + 0x10) goto LAB_0019fa04;
  }
  operator_delete(_Var5._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1));
LAB_0019fa04:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_80);
  std::filesystem::__cxx11::path::~path(&local_58);
  return;
}

Assistant:

void CommandHelp::executeHelp() {
    // On windows open the html pages with the browser
    // On linux/macos open the man pages with man

#if defined(_WIN32)
    DWORD size = 256;
    std::wstring executablePath;
    do {
        size *= 2;
        executablePath.resize(size);
    } while (GetModuleFileNameW(nullptr, executablePath.data(), size) == size);

    PathCchRemoveFileSpec(executablePath.data(), executablePath.size());
    executablePath.resize(wcslen(executablePath.c_str()));

    const auto commandStr = options.command.value_or("");
    const auto systemCommand = fmt::format(L"{}\\..\\share\\doc\\KTX-Software\\html\\ktxtools\\ktx{}{}.html",
            executablePath,
            options.command ? L"_" : L"",
            std::wstring(commandStr.begin(), commandStr.end()));

    auto result = ShellExecuteW(nullptr, nullptr, systemCommand.c_str(), nullptr, nullptr, SW_SHOWNORMAL);
    auto r = reinterpret_cast<INT_PTR>(result);
    if (r <= 32) // WinAPI is weird
        fatal(rc::RUNTIME_ERROR, "Failed to open the html documentation: ERROR {}", r);

#else
#   if defined(__APPLE__)
    char buf[PATH_MAX];
    uint32_t bufsize = PATH_MAX;
    if (const auto ec = _NSGetExecutablePath(buf, &bufsize))
        fatal(rc::RUNTIME_ERROR, "Failed to determine executable path: ERROR {}", ec);
    const auto executablePath = std::filesystem::canonical(buf);
#   else // Linux
    const auto executablePath = std::filesystem::canonical("/proc/self/exe");
#   endif

    const auto executableDir = std::filesystem::path(executablePath).remove_filename();
    const auto manFile = fmt::format("{}/../share/man/man1/ktx{}{}.1",
                executableDir.string(),
                options.command ? "_" : "",
                options.command.value_or(""));
    if (std::filesystem::exists(manFile)) {
        // We have relative access to the man file, prioritize opening it
        // that way to support custom install locations
        const auto systemCommand = fmt::format("man \"{}\"", manFile);
        const auto result = std::system(systemCommand.c_str());
        (void) result;
    } else {
        const auto systemCommand = fmt::format("man ktx{}{}",
                options.command ? "_" : "",
                options.command.value_or(""));
        const auto result = std::system(systemCommand.c_str());
        (void) result;
    }
#endif
}